

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O3

vec_t ImGuizmo::Normalized(vec_t *v)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  vec_t vVar4;
  
  uVar1 = v->x;
  uVar2 = v->y;
  fVar3 = 1.0 / SQRT(v->z * v->z + (float)uVar1 * (float)uVar1 + (float)uVar2 * (float)uVar2);
  vVar4.x = fVar3 * v->x;
  vVar4.y = fVar3 * v->y;
  vVar4.w = fVar3 * v->w;
  vVar4.z = fVar3 * v->z;
  return vVar4;
}

Assistant:

vec_t Normalized(const vec_t& v) { vec_t res; res = v; res.Normalize(); return res; }